

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O2

void __thiscall Fl_Table::col_width(Fl_Table *this,int col,int width)

{
  IntVector *this_00;
  uint uVar1;
  int *piVar2;
  ulong uVar3;
  
  if (-1 < col) {
    this_00 = &this->_colwidths;
    uVar1 = (this->_colwidths)._size;
    uVar3 = (ulong)(int)uVar1;
    if (col < (int)uVar1) {
      piVar2 = this_00->arr;
      if (piVar2[(uint)col] == width) {
        return;
      }
    }
    else {
      IntVector::size(this_00,col + 1);
      piVar2 = this_00->arr;
      for (; (uint)col != uVar3; uVar3 = uVar3 + 1) {
        piVar2[uVar3] = width;
      }
    }
    piVar2[(uint)col] = width;
    table_resized(this);
    if (col <= this->rightcol) {
      Fl_Widget::redraw((Fl_Widget *)this);
    }
    if (((this->super_Fl_Group).super_Fl_Widget.callback_ != (Fl_Callback *)0x0) &&
       (((this->super_Fl_Group).super_Fl_Widget.when_ & 1) != 0)) {
      this->_callback_context = CONTEXT_RC_RESIZE;
      this->_callback_row = 0;
      this->_callback_col = col;
      Fl_Widget::do_callback((Fl_Widget *)this);
      return;
    }
  }
  return;
}

Assistant:

void Fl_Table::col_width(int col, int width)
{
  if ( col < 0 ) return;
  if ( col < (int)_colwidths.size() && _colwidths[col] == width ) {
    return;			// OPTIMIZATION: no change? avoid redraw
  }
  // Add column widths, even if none yet
  int now_size = (int)_colwidths.size();
  if ( col >= now_size ) {
    _colwidths.size(col+1);
    while (now_size < col) {
      _colwidths[now_size++] = width;
    }
  }
  _colwidths[col] = width;
  table_resized();
  if ( col <= rightcol ) {	// OPTIMIZATION: only redraw if onscreen or to the left
    redraw();
  }
  // COLUMN RESIZE CALLBACK
  if ( Fl_Widget::callback() && when() & FL_WHEN_CHANGED ) {
    do_callback(CONTEXT_RC_RESIZE, 0, col);
  }
}